

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<4,_8,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  ushort uVar3;
  ushort uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 (*pauVar37) [16];
  int iVar38;
  uint uVar39;
  undefined4 uVar40;
  long lVar41;
  long lVar42;
  byte bVar43;
  undefined4 uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  long lVar57;
  vint4 ai_1;
  undefined1 auVar60 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar63;
  float fVar72;
  float fVar73;
  vint4 ai;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar65 [32];
  undefined1 auVar64 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar74;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar78;
  float fVar87;
  float fVar88;
  vint4 ai_3;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar89;
  undefined1 auVar86 [32];
  float fVar93;
  float fVar97;
  float fVar98;
  vint4 ai_2;
  undefined1 auVar94 [16];
  float fVar99;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  __m128 a;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  uint uVar122;
  uint uVar123;
  uint uVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar121 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  vint4 bi_1;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> dist;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong local_14b8;
  undefined1 (*local_14b0) [16];
  undefined1 local_1490 [16];
  ulong local_1478;
  RTCFilterFunctionNArguments local_13f0;
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  int local_13a0;
  int iStack_139c;
  int iStack_1398;
  int iStack_1394;
  float local_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float local_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined1 local_1360 [32];
  undefined8 local_1340;
  uint uStack_1338;
  uint uStack_1334;
  uint uStack_1330;
  uint uStack_132c;
  uint uStack_1328;
  uint uStack_1324;
  uint local_1320;
  uint uStack_131c;
  uint uStack_1318;
  uint uStack_1314;
  uint uStack_1310;
  uint uStack_130c;
  uint uStack_1308;
  uint uStack_1304;
  undefined1 local_1300 [32];
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined1 local_12b0 [16];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1200 [32];
  float local_11e0 [4];
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [8];
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar134 [32];
  
  local_14b0 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar77 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_13b0._4_4_ = fVar77;
  local_13b0._0_4_ = fVar77;
  local_13b0._8_4_ = fVar77;
  local_13b0._12_4_ = fVar77;
  auVar113 = ZEXT1664(local_13b0);
  fStack_1374 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_13c0._4_4_ = fStack_1374;
  local_13c0._0_4_ = fStack_1374;
  local_13c0._8_4_ = fStack_1374;
  local_13c0._12_4_ = fStack_1374;
  auVar116 = ZEXT1664(local_13c0);
  fStack_1364 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar77 = fVar77 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fStack_1374 = fStack_1374 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fStack_1384 = fStack_1364 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar38 = (tray->tfar).field_0.i[k];
  local_1490._4_4_ = iVar38;
  local_1490._0_4_ = iVar38;
  local_1490._8_4_ = iVar38;
  local_1490._12_4_ = iVar38;
  auVar107._0_8_ = CONCAT44(fVar77,fVar77) ^ 0x8000000080000000;
  auVar107._8_4_ = -fVar77;
  auVar107._12_4_ = -fVar77;
  local_1380 = -fStack_1374;
  fStack_137c = -fStack_1374;
  fStack_1378 = -fStack_1374;
  fStack_1374 = -fStack_1374;
  local_1390 = -fStack_1384;
  fStack_138c = -fStack_1384;
  fStack_1388 = -fStack_1384;
  fStack_1384 = -fStack_1384;
  iStack_1394 = (tray->tnear).field_0.i[k];
  local_10e0._16_16_ = mm_lookupmask_ps._240_16_;
  local_10e0._0_16_ = mm_lookupmask_ps._0_16_;
  iVar38 = 1 << ((uint)k & 0x1f);
  auVar61._4_4_ = iVar38;
  auVar61._0_4_ = iVar38;
  auVar61._8_4_ = iVar38;
  auVar61._12_4_ = iVar38;
  auVar61._16_4_ = iVar38;
  auVar61._20_4_ = iVar38;
  auVar61._24_4_ = iVar38;
  auVar61._28_4_ = iVar38;
  auVar60 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar61 = vpand_avx2(auVar61,auVar60);
  local_1120 = vpcmpeqd_avx2(auVar61,auVar60);
  auVar60._8_4_ = 0xbf800000;
  auVar60._0_8_ = 0xbf800000bf800000;
  auVar60._12_4_ = 0xbf800000;
  auVar60._16_4_ = 0xbf800000;
  auVar60._20_4_ = 0xbf800000;
  auVar60._24_4_ = 0xbf800000;
  auVar60._28_4_ = 0xbf800000;
  auVar65._8_4_ = 0x3f800000;
  auVar65._0_8_ = &DAT_3f8000003f800000;
  auVar65._12_4_ = 0x3f800000;
  auVar65._16_4_ = 0x3f800000;
  auVar65._20_4_ = 0x3f800000;
  auVar65._24_4_ = 0x3f800000;
  auVar65._28_4_ = 0x3f800000;
  _local_1100 = vblendvps_avx(auVar65,auVar60,local_10e0);
  fStack_1368 = fStack_1364;
  fStack_136c = fStack_1364;
  local_1370 = fStack_1364;
  iStack_1398 = iStack_1394;
  iStack_139c = iStack_1394;
  local_13a0 = iStack_1394;
  while (local_14b0 != (undefined1 (*) [16])&local_fa0) {
    pauVar37 = local_14b0 + -1;
    local_14b0 = local_14b0 + -1;
    if (*(float *)(*pauVar37 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      local_14b8 = *(ulong *)*local_14b0;
      do {
        if ((local_14b8 & 8) == 0) {
          auVar104 = vfmadd132ps_fma(*(undefined1 (*) [16])(local_14b8 + 0x20 + uVar45),auVar107,
                                     auVar113._0_16_);
          auVar16._4_4_ = fStack_137c;
          auVar16._0_4_ = local_1380;
          auVar16._8_4_ = fStack_1378;
          auVar16._12_4_ = fStack_1374;
          auVar64 = vfmadd132ps_fma(*(undefined1 (*) [16])(local_14b8 + 0x20 + uVar47),auVar16,
                                    auVar116._0_16_);
          auVar104 = vpmaxsd_avx(auVar104,auVar64);
          auVar19._4_4_ = fStack_136c;
          auVar19._0_4_ = local_1370;
          auVar19._8_4_ = fStack_1368;
          auVar19._12_4_ = fStack_1364;
          auVar18._4_4_ = fStack_138c;
          auVar18._0_4_ = local_1390;
          auVar18._8_4_ = fStack_1388;
          auVar18._12_4_ = fStack_1384;
          auVar64 = vfmadd132ps_fma(*(undefined1 (*) [16])(local_14b8 + 0x20 + uVar49),auVar18,
                                    auVar19);
          auVar79 = vfmadd132ps_fma(*(undefined1 (*) [16])(local_14b8 + 0x20 + (uVar45 ^ 0x10)),
                                    auVar107,auVar113._0_16_);
          auVar16 = vfmadd132ps_fma(*(undefined1 (*) [16])(local_14b8 + 0x20 + (uVar47 ^ 0x10)),
                                    auVar16,auVar116._0_16_);
          auVar79 = vpminsd_avx(auVar79,auVar16);
          auVar16 = vfmadd132ps_fma(*(undefined1 (*) [16])(local_14b8 + 0x20 + (uVar49 ^ 0x10)),
                                    auVar18,auVar19);
          auVar17._4_4_ = iStack_139c;
          auVar17._0_4_ = local_13a0;
          auVar17._8_4_ = iStack_1398;
          auVar17._12_4_ = iStack_1394;
          auVar64 = vpmaxsd_avx(auVar64,auVar17);
          auVar64 = vpmaxsd_avx(auVar104,auVar64);
          auVar104 = vpminsd_avx(auVar16,local_1490);
          auVar104 = vpminsd_avx(auVar79,auVar104);
          auVar104 = vpcmpgtd_avx(auVar64,auVar104);
          uVar39 = vmovmskps_avx(auVar104);
          local_1478 = ((ulong)uVar39 ^ 0xf) & 0xff;
          local_12a0._0_16_ = auVar64;
        }
        if ((local_14b8 & 8) == 0) {
          if (local_1478 == 0) {
            iVar38 = 4;
          }
          else {
            uVar55 = local_14b8 & 0xfffffffffffffff0;
            lVar42 = 0;
            for (uVar51 = local_1478; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000)
            {
              lVar42 = lVar42 + 1;
            }
            iVar38 = 0;
            uVar51 = local_1478 - 1 & local_1478;
            local_14b8 = *(ulong *)(uVar55 + lVar42 * 8);
            if (uVar51 != 0) {
              uVar39 = *(uint *)(local_12a0 + lVar42 * 4);
              lVar42 = 0;
              for (uVar54 = uVar51; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
                lVar42 = lVar42 + 1;
              }
              uVar51 = uVar51 - 1 & uVar51;
              uVar54 = *(ulong *)(uVar55 + lVar42 * 8);
              uVar52 = *(uint *)(local_12a0 + lVar42 * 4);
              if (uVar51 == 0) {
                if (uVar39 < uVar52) {
                  *(ulong *)*local_14b0 = uVar54;
                  *(uint *)(*local_14b0 + 8) = uVar52;
                  local_14b0 = local_14b0 + 1;
                }
                else {
                  *(ulong *)*local_14b0 = local_14b8;
                  *(uint *)(*local_14b0 + 8) = uVar39;
                  local_14b8 = uVar54;
                  local_14b0 = local_14b0 + 1;
                }
              }
              else {
                auVar104._8_8_ = 0;
                auVar104._0_8_ = local_14b8;
                auVar104 = vpunpcklqdq_avx(auVar104,ZEXT416(uVar39));
                auVar64._8_8_ = 0;
                auVar64._0_8_ = uVar54;
                auVar64 = vpunpcklqdq_avx(auVar64,ZEXT416(uVar52));
                lVar42 = 0;
                for (uVar54 = uVar51; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000)
                {
                  lVar42 = lVar42 + 1;
                }
                uVar51 = uVar51 - 1 & uVar51;
                auVar79._8_8_ = 0;
                auVar79._0_8_ = *(ulong *)(uVar55 + lVar42 * 8);
                auVar16 = vpunpcklqdq_avx(auVar79,ZEXT416(*(uint *)(local_12a0 + lVar42 * 4)));
                auVar79 = vpcmpgtd_avx(auVar64,auVar104);
                if (uVar51 == 0) {
                  auVar17 = vpshufd_avx(auVar79,0xaa);
                  auVar79 = vblendvps_avx(auVar64,auVar104,auVar17);
                  auVar104 = vblendvps_avx(auVar104,auVar64,auVar17);
                  auVar64 = vpcmpgtd_avx(auVar16,auVar79);
                  auVar17 = vpshufd_avx(auVar64,0xaa);
                  auVar64 = vblendvps_avx(auVar16,auVar79,auVar17);
                  auVar79 = vblendvps_avx(auVar79,auVar16,auVar17);
                  auVar16 = vpcmpgtd_avx(auVar79,auVar104);
                  auVar17 = vpshufd_avx(auVar16,0xaa);
                  auVar16 = vblendvps_avx(auVar79,auVar104,auVar17);
                  auVar104 = vblendvps_avx(auVar104,auVar79,auVar17);
                  *local_14b0 = auVar104;
                  local_14b0[1] = auVar16;
                  local_14b8 = vmovlps_avx(auVar64);
                  local_14b0 = local_14b0 + 2;
                }
                else {
                  lVar42 = 0;
                  for (; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
                    lVar42 = lVar42 + 1;
                  }
                  auVar100._8_8_ = 0;
                  auVar100._0_8_ = *(ulong *)(uVar55 + lVar42 * 8);
                  auVar18 = vpunpcklqdq_avx(auVar100,ZEXT416(*(uint *)(local_12a0 + lVar42 * 4)));
                  auVar17 = vpshufd_avx(auVar79,0xaa);
                  auVar79 = vblendvps_avx(auVar64,auVar104,auVar17);
                  auVar104 = vblendvps_avx(auVar104,auVar64,auVar17);
                  auVar64 = vpcmpgtd_avx(auVar18,auVar16);
                  auVar17 = vpshufd_avx(auVar64,0xaa);
                  auVar64 = vblendvps_avx(auVar18,auVar16,auVar17);
                  auVar16 = vblendvps_avx(auVar16,auVar18,auVar17);
                  auVar17 = vpcmpgtd_avx(auVar16,auVar104);
                  auVar18 = vpshufd_avx(auVar17,0xaa);
                  auVar17 = vblendvps_avx(auVar16,auVar104,auVar18);
                  auVar104 = vblendvps_avx(auVar104,auVar16,auVar18);
                  auVar16 = vpcmpgtd_avx(auVar64,auVar79);
                  auVar18 = vpshufd_avx(auVar16,0xaa);
                  auVar16 = vblendvps_avx(auVar64,auVar79,auVar18);
                  auVar64 = vblendvps_avx(auVar79,auVar64,auVar18);
                  auVar79 = vpcmpgtd_avx(auVar17,auVar64);
                  auVar18 = vpshufd_avx(auVar79,0xaa);
                  auVar79 = vblendvps_avx(auVar17,auVar64,auVar18);
                  auVar64 = vblendvps_avx(auVar64,auVar17,auVar18);
                  *local_14b0 = auVar104;
                  local_14b0[1] = auVar64;
                  local_14b0[2] = auVar79;
                  local_14b8 = vmovlps_avx(auVar16);
                  local_14b0 = local_14b0 + 3;
                }
              }
            }
          }
        }
        else {
          iVar38 = 6;
        }
      } while (iVar38 == 0);
      if (iVar38 == 6) {
        uVar51 = (ulong)((uint)local_14b8 & 0xf);
        if (uVar51 != 8) {
          local_14b8 = local_14b8 & 0xfffffffffffffff0;
          lVar42 = 0;
          do {
            lVar41 = lVar42 * 0x58;
            lVar1 = local_14b8 + lVar41;
            uVar40 = *(undefined4 *)(local_14b8 + 0x38 + lVar41);
            auVar80._4_4_ = uVar40;
            auVar80._0_4_ = uVar40;
            auVar80._8_4_ = uVar40;
            auVar80._12_4_ = uVar40;
            uVar40 = *(undefined4 *)(local_14b8 + 0x44 + lVar41);
            auVar94._4_4_ = uVar40;
            auVar94._0_4_ = uVar40;
            auVar94._8_4_ = uVar40;
            auVar94._12_4_ = uVar40;
            auVar58._8_8_ = 0;
            auVar58._0_8_ = *(ulong *)((uVar45 >> 2) + 0x20 + lVar1);
            auVar104 = vpmovzxbd_avx(auVar58);
            auVar104 = vcvtdq2ps_avx(auVar104);
            auVar79 = vfmadd213ps_fma(auVar104,auVar94,auVar80);
            auVar59._8_8_ = 0;
            auVar59._0_8_ = *(ulong *)(((uVar45 ^ 0x10) >> 2) + 0x20 + lVar1);
            auVar104 = vpmovzxbd_avx(auVar59);
            auVar104 = vcvtdq2ps_avx(auVar104);
            auVar16 = vfmadd213ps_fma(auVar104,auVar94,auVar80);
            uVar40 = *(undefined4 *)(local_14b8 + 0x3c + lVar41);
            auVar101._4_4_ = uVar40;
            auVar101._0_4_ = uVar40;
            auVar101._8_4_ = uVar40;
            auVar101._12_4_ = uVar40;
            uVar40 = *(undefined4 *)(local_14b8 + 0x48 + lVar41);
            auVar108._4_4_ = uVar40;
            auVar108._0_4_ = uVar40;
            auVar108._8_4_ = uVar40;
            auVar108._12_4_ = uVar40;
            auVar81._8_8_ = 0;
            auVar81._0_8_ = *(ulong *)((uVar47 >> 2) + 0x20 + lVar1);
            auVar104 = vpmovzxbd_avx(auVar81);
            auVar104 = vcvtdq2ps_avx(auVar104);
            auVar17 = vfmadd213ps_fma(auVar104,auVar108,auVar101);
            auVar82._8_8_ = 0;
            auVar82._0_8_ = *(ulong *)(((uVar47 ^ 0x10) >> 2) + 0x20 + lVar1);
            auVar104 = vpmovzxbd_avx(auVar82);
            auVar104 = vcvtdq2ps_avx(auVar104);
            auVar18 = vfmadd213ps_fma(auVar104,auVar108,auVar101);
            uVar40 = *(undefined4 *)(local_14b8 + 0x40 + lVar41);
            auVar102._4_4_ = uVar40;
            auVar102._0_4_ = uVar40;
            auVar102._8_4_ = uVar40;
            auVar102._12_4_ = uVar40;
            uVar40 = *(undefined4 *)(local_14b8 + 0x4c + lVar41);
            auVar109._4_4_ = uVar40;
            auVar109._0_4_ = uVar40;
            auVar109._8_4_ = uVar40;
            auVar109._12_4_ = uVar40;
            auVar112._8_8_ = 0;
            auVar112._0_8_ = *(ulong *)((uVar49 >> 2) + 0x20 + lVar1);
            auVar104 = vpmovzxbd_avx(auVar112);
            auVar104 = vcvtdq2ps_avx(auVar104);
            auVar19 = vfmadd213ps_fma(auVar104,auVar109,auVar102);
            auVar114._8_8_ = 0;
            auVar114._0_8_ = *(ulong *)(((uVar49 ^ 0x10) >> 2) + 0x20 + lVar1);
            auVar104 = vpmovzxbd_avx(auVar114);
            auVar104 = vcvtdq2ps_avx(auVar104);
            auVar100 = vfmadd213ps_fma(auVar104,auVar109,auVar102);
            auVar103._8_8_ = 0;
            auVar103._0_8_ = *(ulong *)(local_14b8 + 0x20 + lVar41);
            auVar110._8_8_ = 0;
            auVar110._0_8_ = *(ulong *)(local_14b8 + 0x24 + lVar41);
            auVar64 = vpminub_avx(auVar103,auVar110);
            auVar104 = vpcmpeqb_avx(auVar103,auVar64);
            auVar64 = vpcmpeqd_avx(auVar64,auVar64);
            auVar104 = vpmovzxbd_avx(auVar104 ^ auVar64);
            auVar104 = vpslld_avx(auVar104 ^ auVar64,0x1f);
            uVar40 = vmovmskps_avx(auVar104);
            auVar104 = vfmadd213ps_fma(auVar79,local_13b0,auVar107);
            auVar13._4_4_ = fStack_137c;
            auVar13._0_4_ = local_1380;
            auVar13._8_4_ = fStack_1378;
            auVar13._12_4_ = fStack_1374;
            auVar64 = vfmadd213ps_fma(auVar17,local_13c0,auVar13);
            auVar104 = vpmaxsd_avx(auVar104,auVar64);
            auVar64 = vfmadd213ps_fma(auVar16,local_13b0,auVar107);
            auVar79 = vfmadd213ps_fma(auVar18,local_13c0,auVar13);
            auVar79 = vpminsd_avx(auVar64,auVar79);
            auVar14._4_4_ = fStack_136c;
            auVar14._0_4_ = local_1370;
            auVar14._8_4_ = fStack_1368;
            auVar14._12_4_ = fStack_1364;
            auVar12._4_4_ = fStack_138c;
            auVar12._0_4_ = local_1390;
            auVar12._8_4_ = fStack_1388;
            auVar12._12_4_ = fStack_1384;
            auVar64 = vfmadd213ps_fma(auVar19,auVar14,auVar12);
            auVar11._4_4_ = iStack_139c;
            auVar11._0_4_ = local_13a0;
            auVar11._8_4_ = iStack_1398;
            auVar11._12_4_ = iStack_1394;
            auVar64 = vpmaxsd_avx(auVar64,auVar11);
            local_12b0 = vpmaxsd_avx(auVar104,auVar64);
            auVar104 = vfmadd213ps_fma(auVar100,auVar14,auVar12);
            auVar104 = vpminsd_avx(auVar104,local_1490);
            auVar104 = vpminsd_avx(auVar79,auVar104);
            auVar104 = vpcmpgtd_avx(local_12b0,auVar104);
            uVar44 = vmovmskps_avx(auVar104);
            bVar43 = ~(byte)uVar44 & (byte)uVar40;
            if (bVar43 != 0) {
              uVar55 = (ulong)bVar43;
              do {
                lVar41 = 0;
                for (uVar54 = uVar55; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000)
                {
                  lVar41 = lVar41 + 1;
                }
                fVar77 = *(float *)(ray + k * 4 + 0x100);
                if (*(float *)(local_12b0 + lVar41 * 4) <= fVar77) {
                  uVar3 = *(ushort *)(lVar1 + lVar41 * 8);
                  uVar4 = *(ushort *)(lVar1 + 2 + lVar41 * 8);
                  local_1320 = *(uint *)(lVar1 + 0x50);
                  uStack_1338 = *(uint *)(lVar1 + 4 + lVar41 * 8);
                  pGVar5 = (context->scene->geometries).items[local_1320].ptr;
                  lVar41 = *(long *)&pGVar5->field_0x58;
                  lVar50 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uStack_1338;
                  uVar52 = uVar3 & 0x7fff;
                  uVar53 = uVar4 & 0x7fff;
                  uVar39 = *(uint *)(lVar41 + 4 + lVar50);
                  uVar56 = (ulong)uVar39;
                  uVar46 = (ulong)(uVar39 * uVar53 + *(int *)(lVar41 + lVar50) + uVar52);
                  p_Var6 = pGVar5[1].intersectionFilterN;
                  lVar7 = *(long *)&pGVar5[1].time_range.upper;
                  auVar104 = *(undefined1 (*) [16])(lVar7 + (uVar46 + 1) * (long)p_Var6);
                  auVar64 = *(undefined1 (*) [16])(lVar7 + (uVar46 + uVar56) * (long)p_Var6);
                  lVar48 = uVar46 + uVar56 + 1;
                  auVar79 = *(undefined1 (*) [16])(lVar7 + lVar48 * (long)p_Var6);
                  auVar16 = *(undefined1 (*) [16])
                             (lVar7 + (uVar46 + (-1 < (short)uVar3) + 1) * (long)p_Var6);
                  lVar57 = (ulong)(-1 < (short)uVar3) + lVar48;
                  auVar17 = *(undefined1 (*) [16])(lVar7 + lVar57 * (long)p_Var6);
                  uVar54 = 0;
                  if (-1 < (short)uVar4) {
                    uVar54 = uVar56;
                  }
                  auVar18 = *(undefined1 (*) [16])
                             (lVar7 + (uVar46 + uVar56 + uVar54) * (long)p_Var6);
                  auVar19 = *(undefined1 (*) [16])(lVar7 + (lVar48 + uVar54) * (long)p_Var6);
                  auVar119._16_16_ =
                       *(undefined1 (*) [16])(lVar7 + (uVar54 + lVar57) * (long)p_Var6);
                  auVar119._0_16_ = auVar79;
                  auVar11 = vunpcklps_avx(auVar104,auVar17);
                  auVar100 = vunpckhps_avx(auVar104,auVar17);
                  auVar12 = vunpcklps_avx(auVar16,auVar79);
                  auVar16 = vunpckhps_avx(auVar16,auVar79);
                  auVar13 = vunpcklps_avx(auVar100,auVar16);
                  auVar14 = vunpcklps_avx(auVar11,auVar12);
                  auVar16 = vunpckhps_avx(auVar11,auVar12);
                  auVar11 = vunpcklps_avx(auVar64,auVar19);
                  auVar100 = vunpckhps_avx(auVar64,auVar19);
                  auVar12 = vunpcklps_avx(auVar79,auVar18);
                  auVar18 = vunpckhps_avx(auVar79,auVar18);
                  auVar100 = vunpcklps_avx(auVar100,auVar18);
                  auVar58 = vunpcklps_avx(auVar11,auVar12);
                  auVar18 = vunpckhps_avx(auVar11,auVar12);
                  auVar95._16_16_ = auVar19;
                  auVar95._0_16_ = auVar64;
                  auVar83._16_16_ = auVar17;
                  auVar83._0_16_ = auVar104;
                  auVar61 = vunpcklps_avx(auVar83,auVar95);
                  auVar66._16_16_ = auVar79;
                  auVar66._0_16_ = *(undefined1 (*) [16])(lVar7 + (long)p_Var6 * uVar46);
                  auVar60 = vunpcklps_avx(auVar66,auVar119);
                  auVar15 = vunpcklps_avx(auVar60,auVar61);
                  auVar10 = vunpckhps_avx(auVar60,auVar61);
                  auVar61 = vunpckhps_avx(auVar83,auVar95);
                  auVar60 = vunpckhps_avx(auVar66,auVar119);
                  auVar83 = vunpcklps_avx(auVar60,auVar61);
                  auVar67._16_16_ = auVar14;
                  auVar67._0_16_ = auVar14;
                  auVar84._16_16_ = auVar16;
                  auVar84._0_16_ = auVar16;
                  auVar106._16_16_ = auVar13;
                  auVar106._0_16_ = auVar13;
                  auVar117._16_16_ = auVar58;
                  auVar117._0_16_ = auVar58;
                  auVar128._16_16_ = auVar18;
                  auVar128._0_16_ = auVar18;
                  auVar130._16_16_ = auVar100;
                  auVar130._0_16_ = auVar100;
                  auVar60 = vsubps_avx(auVar15,auVar67);
                  auVar61 = vsubps_avx(auVar10,auVar84);
                  auVar65 = vsubps_avx(auVar83,auVar106);
                  auVar66 = vsubps_avx(auVar117,auVar15);
                  auVar8 = vsubps_avx(auVar128,auVar10);
                  auVar9 = vsubps_avx(auVar130,auVar83);
                  auVar20._4_4_ = auVar61._4_4_ * auVar9._4_4_;
                  auVar20._0_4_ = auVar61._0_4_ * auVar9._0_4_;
                  auVar20._8_4_ = auVar61._8_4_ * auVar9._8_4_;
                  auVar20._12_4_ = auVar61._12_4_ * auVar9._12_4_;
                  auVar20._16_4_ = auVar61._16_4_ * auVar9._16_4_;
                  auVar20._20_4_ = auVar61._20_4_ * auVar9._20_4_;
                  auVar20._24_4_ = auVar61._24_4_ * auVar9._24_4_;
                  auVar20._28_4_ = auVar14._12_4_;
                  auVar17 = vfmsub231ps_fma(auVar20,auVar8,auVar65);
                  auVar21._4_4_ = auVar65._4_4_ * auVar66._4_4_;
                  auVar21._0_4_ = auVar65._0_4_ * auVar66._0_4_;
                  auVar21._8_4_ = auVar65._8_4_ * auVar66._8_4_;
                  auVar21._12_4_ = auVar65._12_4_ * auVar66._12_4_;
                  auVar21._16_4_ = auVar65._16_4_ * auVar66._16_4_;
                  auVar21._20_4_ = auVar65._20_4_ * auVar66._20_4_;
                  auVar21._24_4_ = auVar65._24_4_ * auVar66._24_4_;
                  auVar21._28_4_ = auVar16._12_4_;
                  auVar16 = vfmsub231ps_fma(auVar21,auVar9,auVar60);
                  uVar40 = *(undefined4 *)(ray + k * 4);
                  auVar133._4_4_ = uVar40;
                  auVar133._0_4_ = uVar40;
                  auVar133._8_4_ = uVar40;
                  auVar133._12_4_ = uVar40;
                  auVar133._16_4_ = uVar40;
                  auVar133._20_4_ = uVar40;
                  auVar133._24_4_ = uVar40;
                  auVar133._28_4_ = uVar40;
                  uVar40 = *(undefined4 *)(ray + k * 4 + 0x20);
                  auVar135._4_4_ = uVar40;
                  auVar135._0_4_ = uVar40;
                  auVar135._8_4_ = uVar40;
                  auVar135._12_4_ = uVar40;
                  auVar135._16_4_ = uVar40;
                  auVar135._20_4_ = uVar40;
                  auVar135._24_4_ = uVar40;
                  auVar135._28_4_ = uVar40;
                  uVar40 = *(undefined4 *)(ray + k * 4 + 0x40);
                  auVar137._4_4_ = uVar40;
                  auVar137._0_4_ = uVar40;
                  auVar137._8_4_ = uVar40;
                  auVar137._12_4_ = uVar40;
                  auVar137._16_4_ = uVar40;
                  auVar137._20_4_ = uVar40;
                  auVar137._24_4_ = uVar40;
                  auVar137._28_4_ = uVar40;
                  fVar93 = *(float *)(ray + k * 4 + 0x80);
                  auVar129._4_4_ = fVar93;
                  auVar129._0_4_ = fVar93;
                  auVar129._8_4_ = fVar93;
                  auVar129._12_4_ = fVar93;
                  auVar129._16_4_ = fVar93;
                  auVar129._20_4_ = fVar93;
                  auVar129._24_4_ = fVar93;
                  auVar129._28_4_ = fVar93;
                  auVar15 = vsubps_avx(auVar15,auVar133);
                  fVar63 = *(float *)(ray + k * 4 + 0xa0);
                  auVar132._4_4_ = fVar63;
                  auVar132._0_4_ = fVar63;
                  auVar132._8_4_ = fVar63;
                  auVar132._12_4_ = fVar63;
                  auVar134._16_4_ = fVar63;
                  auVar134._0_16_ = auVar132;
                  auVar134._20_4_ = fVar63;
                  auVar134._24_4_ = fVar63;
                  auVar134._28_4_ = fVar63;
                  auVar10 = vsubps_avx(auVar10,auVar135);
                  fVar125 = *(float *)(ray + k * 4 + 0xc0);
                  auVar136._4_4_ = fVar125;
                  auVar136._0_4_ = fVar125;
                  auVar136._8_4_ = fVar125;
                  auVar136._12_4_ = fVar125;
                  auVar136._16_4_ = fVar125;
                  auVar136._20_4_ = fVar125;
                  auVar136._24_4_ = fVar125;
                  auVar136._28_4_ = fVar125;
                  auVar83 = vsubps_avx(auVar83,auVar137);
                  auVar22._4_4_ = fVar93 * auVar10._4_4_;
                  auVar22._0_4_ = fVar93 * auVar10._0_4_;
                  auVar22._8_4_ = fVar93 * auVar10._8_4_;
                  auVar22._12_4_ = fVar93 * auVar10._12_4_;
                  auVar22._16_4_ = fVar93 * auVar10._16_4_;
                  auVar22._20_4_ = fVar93 * auVar10._20_4_;
                  auVar22._24_4_ = fVar93 * auVar10._24_4_;
                  auVar22._28_4_ = uVar40;
                  auVar104 = vfmsub231ps_fma(auVar22,auVar15,auVar134);
                  auVar23._4_4_ = auVar9._4_4_ * auVar104._4_4_;
                  auVar23._0_4_ = auVar9._0_4_ * auVar104._0_4_;
                  auVar23._8_4_ = auVar9._8_4_ * auVar104._8_4_;
                  auVar23._12_4_ = auVar9._12_4_ * auVar104._12_4_;
                  auVar23._16_4_ = auVar9._16_4_ * 0.0;
                  auVar23._20_4_ = auVar9._20_4_ * 0.0;
                  auVar23._24_4_ = auVar9._24_4_ * 0.0;
                  auVar23._28_4_ = auVar9._28_4_;
                  auVar138._0_4_ = auVar65._0_4_ * auVar104._0_4_;
                  auVar138._4_4_ = auVar65._4_4_ * auVar104._4_4_;
                  auVar138._8_4_ = auVar65._8_4_ * auVar104._8_4_;
                  auVar138._12_4_ = auVar65._12_4_ * auVar104._12_4_;
                  auVar138._16_4_ = auVar65._16_4_ * 0.0;
                  auVar138._20_4_ = auVar65._20_4_ * 0.0;
                  auVar138._24_4_ = auVar65._24_4_ * 0.0;
                  auVar138._28_4_ = 0;
                  auVar9._4_4_ = fVar125 * auVar15._4_4_;
                  auVar9._0_4_ = fVar125 * auVar15._0_4_;
                  auVar9._8_4_ = fVar125 * auVar15._8_4_;
                  auVar9._12_4_ = fVar125 * auVar15._12_4_;
                  auVar9._16_4_ = fVar125 * auVar15._16_4_;
                  auVar9._20_4_ = fVar125 * auVar15._20_4_;
                  auVar9._24_4_ = fVar125 * auVar15._24_4_;
                  auVar9._28_4_ = auVar65._28_4_;
                  auVar64 = vfmsub231ps_fma(auVar9,auVar83,auVar129);
                  auVar104 = vfmadd231ps_fma(auVar23,ZEXT1632(auVar64),auVar8);
                  auVar64 = vfmadd231ps_fma(auVar138,auVar61,ZEXT1632(auVar64));
                  auVar24._4_4_ = auVar60._4_4_ * auVar8._4_4_;
                  auVar24._0_4_ = auVar60._0_4_ * auVar8._0_4_;
                  auVar24._8_4_ = auVar60._8_4_ * auVar8._8_4_;
                  auVar24._12_4_ = auVar60._12_4_ * auVar8._12_4_;
                  auVar24._16_4_ = auVar60._16_4_ * auVar8._16_4_;
                  auVar24._20_4_ = auVar60._20_4_ * auVar8._20_4_;
                  auVar24._24_4_ = auVar60._24_4_ * auVar8._24_4_;
                  auVar24._28_4_ = auVar8._28_4_;
                  auVar79 = vfmsub231ps_fma(auVar24,auVar66,auVar61);
                  auVar8._4_4_ = fVar63 * auVar83._4_4_;
                  auVar8._0_4_ = fVar63 * auVar83._0_4_;
                  auVar8._8_4_ = fVar63 * auVar83._8_4_;
                  auVar8._12_4_ = fVar63 * auVar83._12_4_;
                  auVar8._16_4_ = fVar63 * auVar83._16_4_;
                  auVar8._20_4_ = fVar63 * auVar83._20_4_;
                  auVar8._24_4_ = fVar63 * auVar83._24_4_;
                  auVar8._28_4_ = auVar61._28_4_;
                  auVar18 = vfmsub231ps_fma(auVar8,auVar10,auVar136);
                  fVar93 = auVar79._0_4_;
                  fVar63 = auVar79._4_4_;
                  auVar25._4_4_ = fVar125 * fVar63;
                  auVar25._0_4_ = fVar125 * fVar93;
                  fVar72 = auVar79._8_4_;
                  auVar25._8_4_ = fVar125 * fVar72;
                  fVar73 = auVar79._12_4_;
                  auVar25._12_4_ = fVar125 * fVar73;
                  auVar25._16_4_ = fVar125 * 0.0;
                  auVar25._20_4_ = fVar125 * 0.0;
                  auVar25._24_4_ = fVar125 * 0.0;
                  auVar25._28_4_ = fVar125;
                  auVar79 = vfmadd231ps_fma(auVar25,ZEXT1632(auVar16),auVar134);
                  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),ZEXT1632(auVar17),auVar129);
                  auVar121._8_4_ = 0x80000000;
                  auVar121._0_8_ = 0x8000000080000000;
                  auVar121._12_4_ = 0x80000000;
                  auVar121._16_4_ = 0x80000000;
                  auVar121._20_4_ = 0x80000000;
                  auVar121._24_4_ = 0x80000000;
                  auVar121._28_4_ = 0x80000000;
                  auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT1632(auVar18),auVar66);
                  auVar61 = vandps_avx(ZEXT1632(auVar79),auVar121);
                  uVar39 = auVar61._0_4_;
                  auVar118._0_4_ = (float)(uVar39 ^ auVar104._0_4_);
                  uVar122 = auVar61._4_4_;
                  auVar118._4_4_ = (float)(uVar122 ^ auVar104._4_4_);
                  uVar123 = auVar61._8_4_;
                  auVar118._8_4_ = (float)(uVar123 ^ auVar104._8_4_);
                  uVar124 = auVar61._12_4_;
                  auVar118._12_4_ = (float)(uVar124 ^ auVar104._12_4_);
                  fVar125 = auVar61._16_4_;
                  auVar118._16_4_ = fVar125;
                  fVar126 = auVar61._20_4_;
                  auVar118._20_4_ = fVar126;
                  fVar127 = auVar61._24_4_;
                  auVar118._24_4_ = fVar127;
                  fVar74 = auVar61._28_4_;
                  auVar118._28_4_ = fVar74;
                  auVar104 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar60,ZEXT1632(auVar18));
                  auVar120._0_4_ = (float)(uVar39 ^ auVar104._0_4_);
                  auVar120._4_4_ = (float)(uVar122 ^ auVar104._4_4_);
                  auVar120._8_4_ = (float)(uVar123 ^ auVar104._8_4_);
                  auVar120._12_4_ = (float)(uVar124 ^ auVar104._12_4_);
                  auVar120._16_4_ = fVar125;
                  auVar120._20_4_ = fVar126;
                  auVar120._24_4_ = fVar127;
                  auVar120._28_4_ = fVar74;
                  auVar61 = vcmpps_avx(auVar118,ZEXT832(0) << 0x20,5);
                  auVar60 = vcmpps_avx(auVar120,ZEXT832(0) << 0x20,5);
                  auVar61 = vandps_avx(auVar60,auVar61);
                  auVar96._8_4_ = 0x7fffffff;
                  auVar96._0_8_ = 0x7fffffff7fffffff;
                  auVar96._12_4_ = 0x7fffffff;
                  auVar96._16_4_ = 0x7fffffff;
                  auVar96._20_4_ = 0x7fffffff;
                  auVar96._24_4_ = 0x7fffffff;
                  auVar96._28_4_ = 0x7fffffff;
                  local_1240 = vandps_avx(ZEXT1632(auVar79),auVar96);
                  auVar60 = vcmpps_avx(ZEXT1632(auVar79),ZEXT832(0) << 0x20,4);
                  auVar61 = vandps_avx(auVar61,auVar60);
                  auVar131._0_4_ = auVar118._0_4_ + auVar120._0_4_;
                  auVar131._4_4_ = auVar118._4_4_ + auVar120._4_4_;
                  auVar131._8_4_ = auVar118._8_4_ + auVar120._8_4_;
                  auVar131._12_4_ = auVar118._12_4_ + auVar120._12_4_;
                  auVar131._16_4_ = fVar125 + fVar125;
                  auVar131._20_4_ = fVar126 + fVar126;
                  auVar131._24_4_ = fVar127 + fVar127;
                  auVar131._28_4_ = fVar74 + fVar74;
                  auVar60 = vcmpps_avx(auVar131,local_1240,2);
                  auVar65 = auVar60 & auVar61;
                  if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar65 >> 0x7f,0) != '\0') ||
                        (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar65 >> 0xbf,0) != '\0') ||
                      (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar65[0x1f] < '\0') {
                    auVar61 = vandps_avx(auVar61,auVar60);
                    auVar104 = vpackssdw_avx(auVar61._0_16_,auVar61._16_16_);
                    auVar26._4_4_ = fVar63 * auVar83._4_4_;
                    auVar26._0_4_ = fVar93 * auVar83._0_4_;
                    auVar26._8_4_ = fVar72 * auVar83._8_4_;
                    auVar26._12_4_ = fVar73 * auVar83._12_4_;
                    auVar26._16_4_ = auVar83._16_4_ * 0.0;
                    auVar26._20_4_ = auVar83._20_4_ * 0.0;
                    auVar26._24_4_ = auVar83._24_4_ * 0.0;
                    auVar26._28_4_ = auVar83._28_4_;
                    auVar64 = vfmadd213ps_fma(auVar10,ZEXT1632(auVar16),auVar26);
                    auVar64 = vfmadd213ps_fma(auVar15,ZEXT1632(auVar17),ZEXT1632(auVar64));
                    local_1260._0_4_ = (float)(uVar39 ^ auVar64._0_4_);
                    local_1260._4_4_ = (float)(uVar122 ^ auVar64._4_4_);
                    local_1260._8_4_ = (float)(uVar123 ^ auVar64._8_4_);
                    local_1260._12_4_ = (float)(uVar124 ^ auVar64._12_4_);
                    local_1260._16_4_ = fVar125;
                    local_1260._20_4_ = fVar126;
                    local_1260._24_4_ = fVar127;
                    local_1260._28_4_ = fVar74;
                    fVar74 = *(float *)(ray + k * 4 + 0x60);
                    fVar78 = local_1240._0_4_;
                    fVar87 = local_1240._4_4_;
                    auVar15._4_4_ = fVar87 * fVar74;
                    auVar15._0_4_ = fVar78 * fVar74;
                    fVar88 = local_1240._8_4_;
                    auVar15._8_4_ = fVar88 * fVar74;
                    fVar89 = local_1240._12_4_;
                    auVar15._12_4_ = fVar89 * fVar74;
                    fVar90 = local_1240._16_4_;
                    auVar15._16_4_ = fVar90 * fVar74;
                    fVar91 = local_1240._20_4_;
                    auVar15._20_4_ = fVar91 * fVar74;
                    fVar92 = local_1240._24_4_;
                    auVar15._24_4_ = fVar92 * fVar74;
                    auVar15._28_4_ = fVar74;
                    auVar61 = vcmpps_avx(auVar15,local_1260,1);
                    auVar10._4_4_ = fVar77 * fVar87;
                    auVar10._0_4_ = fVar77 * fVar78;
                    auVar10._8_4_ = fVar77 * fVar88;
                    auVar10._12_4_ = fVar77 * fVar89;
                    auVar10._16_4_ = fVar77 * fVar90;
                    auVar10._20_4_ = fVar77 * fVar91;
                    auVar10._24_4_ = fVar77 * fVar92;
                    auVar10._28_4_ = fVar77;
                    auVar60 = vcmpps_avx(local_1260,auVar10,2);
                    auVar61 = vandps_avx(auVar60,auVar61);
                    auVar64 = vpackssdw_avx(auVar61._0_16_,auVar61._16_16_);
                    auVar104 = vpand_avx(auVar104,auVar64);
                    auVar61 = vpmovzxwd_avx2(auVar104);
                    auVar61 = vpslld_avx2(auVar61,0x1f);
                    if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar61 >> 0x7f,0) != '\0') ||
                          (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar61 >> 0xbf,0) != '\0') ||
                        (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar61[0x1f] < '\0') {
                      local_1200 = vpsrad_avx2(auVar61,0x1f);
                      auVar61 = vsubps_avx(local_1240,auVar120);
                      auVar61 = vblendvps_avx(auVar118,auVar61,local_10e0);
                      auVar60 = vsubps_avx(local_1240,auVar118);
                      auVar60 = vblendvps_avx(auVar120,auVar60,local_10e0);
                      local_1180._0_4_ = (float)local_1100._0_4_ * auVar17._0_4_;
                      local_1180._4_4_ = (float)local_1100._4_4_ * auVar17._4_4_;
                      local_1180._8_4_ = fStack_10f8 * auVar17._8_4_;
                      local_1180._12_4_ = fStack_10f4 * auVar17._12_4_;
                      local_1180._16_4_ = fStack_10f0 * 0.0;
                      local_1180._20_4_ = fStack_10ec * 0.0;
                      local_1180._24_4_ = fStack_10e8 * 0.0;
                      local_1180._28_4_ = 0;
                      local_1160._4_4_ = (float)local_1100._4_4_ * auVar16._4_4_;
                      local_1160._0_4_ = (float)local_1100._0_4_ * auVar16._0_4_;
                      local_1160._8_4_ = fStack_10f8 * auVar16._8_4_;
                      local_1160._12_4_ = fStack_10f4 * auVar16._12_4_;
                      local_1160._16_4_ = fStack_10f0 * 0.0;
                      local_1160._20_4_ = fStack_10ec * 0.0;
                      local_1160._24_4_ = fStack_10e8 * 0.0;
                      local_1160._28_4_ = 0;
                      local_1140._4_4_ = (float)local_1100._4_4_ * fVar63;
                      local_1140._0_4_ = (float)local_1100._0_4_ * fVar93;
                      local_1140._8_4_ = fStack_10f8 * fVar72;
                      local_1140._12_4_ = fStack_10f4 * fVar73;
                      local_1140._16_4_ = fStack_10f0 * 0.0;
                      local_1140._20_4_ = fStack_10ec * 0.0;
                      local_1140._24_4_ = fStack_10e8 * 0.0;
                      local_1140._28_4_ = 0;
                      auVar68._0_8_ = (ulong)CONCAT24(uVar3,(uint)uVar3) & 0x7fff00007fff;
                      auVar68._8_4_ = uVar52;
                      auVar68._12_4_ = uVar52;
                      auVar68._16_4_ = uVar52;
                      auVar68._20_4_ = uVar52;
                      auVar68._24_4_ = uVar52;
                      auVar68._28_4_ = uVar52;
                      auVar65 = vpaddd_avx2(auVar68,_DAT_0205d4c0);
                      auVar105._0_4_ = (float)(int)(*(ushort *)(lVar41 + 8 + lVar50) - 1);
                      auVar105._4_12_ = auVar132._4_12_;
                      auVar85._0_8_ = (ulong)CONCAT24(uVar4,(uint)uVar4) & 0x7fff00007fff;
                      auVar85._8_4_ = uVar53;
                      auVar85._12_4_ = uVar53;
                      auVar85._16_4_ = uVar53;
                      auVar85._20_4_ = uVar53;
                      auVar85._24_4_ = uVar53;
                      auVar85._28_4_ = uVar53;
                      auVar66 = vpaddd_avx2(auVar85,_DAT_0205d4e0);
                      auVar104 = vrcpss_avx(auVar105,auVar105);
                      auVar115._0_4_ = (float)(int)(*(ushort *)(lVar41 + 10 + lVar50) - 1);
                      auVar115._4_12_ = auVar132._4_12_;
                      auVar64 = vfnmadd213ss_fma(auVar105,auVar104,SUB6416(ZEXT464(0x40000000),0));
                      fVar77 = auVar104._0_4_ * auVar64._0_4_;
                      auVar104 = vrcpss_avx(auVar115,auVar115);
                      auVar64 = vfnmadd213ss_fma(auVar115,auVar104,SUB6416(ZEXT464(0x40000000),0));
                      fVar93 = auVar104._0_4_ * auVar64._0_4_;
                      auVar65 = vcvtdq2ps_avx(auVar65);
                      fStack_11c4 = auVar65._28_4_ + auVar61._28_4_;
                      fVar63 = (fVar78 * auVar65._0_4_ + auVar61._0_4_) * fVar77;
                      fVar72 = (fVar87 * auVar65._4_4_ + auVar61._4_4_) * fVar77;
                      local_12a0._4_4_ = fVar72;
                      local_12a0._0_4_ = fVar63;
                      fVar73 = (fVar88 * auVar65._8_4_ + auVar61._8_4_) * fVar77;
                      local_12a0._8_4_ = fVar73;
                      fVar74 = (fVar89 * auVar65._12_4_ + auVar61._12_4_) * fVar77;
                      local_12a0._12_4_ = fVar74;
                      fVar75 = (fVar90 * auVar65._16_4_ + auVar61._16_4_) * fVar77;
                      local_12a0._16_4_ = fVar75;
                      fVar76 = (fVar91 * auVar65._20_4_ + auVar61._20_4_) * fVar77;
                      local_12a0._20_4_ = fVar76;
                      fVar77 = (fVar92 * auVar65._24_4_ + auVar61._24_4_) * fVar77;
                      local_12a0._24_4_ = fVar77;
                      local_12a0._28_4_ = fStack_11c4;
                      auVar61 = vcvtdq2ps_avx(auVar66);
                      fVar78 = (fVar78 * auVar61._0_4_ + auVar60._0_4_) * fVar93;
                      fVar87 = (fVar87 * auVar61._4_4_ + auVar60._4_4_) * fVar93;
                      local_1280._4_4_ = fVar87;
                      local_1280._0_4_ = fVar78;
                      fVar88 = (fVar88 * auVar61._8_4_ + auVar60._8_4_) * fVar93;
                      local_1280._8_4_ = fVar88;
                      fVar89 = (fVar89 * auVar61._12_4_ + auVar60._12_4_) * fVar93;
                      local_1280._12_4_ = fVar89;
                      fVar90 = (fVar90 * auVar61._16_4_ + auVar60._16_4_) * fVar93;
                      local_1280._16_4_ = fVar90;
                      fVar91 = (fVar91 * auVar61._20_4_ + auVar60._20_4_) * fVar93;
                      local_1280._20_4_ = fVar91;
                      fVar92 = (fVar92 * auVar61._24_4_ + auVar60._24_4_) * fVar93;
                      local_1280._24_4_ = fVar92;
                      local_1280._28_4_ = fVar93;
                      if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        auVar61 = vrcpps_avx(local_1240);
                        auVar111._8_4_ = 0x3f800000;
                        auVar111._0_8_ = &DAT_3f8000003f800000;
                        auVar111._12_4_ = 0x3f800000;
                        auVar111._16_4_ = 0x3f800000;
                        auVar111._20_4_ = 0x3f800000;
                        auVar111._24_4_ = 0x3f800000;
                        auVar111._28_4_ = 0x3f800000;
                        auVar104 = vfnmadd213ps_fma(local_1240,auVar61,auVar111);
                        auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar61,auVar61);
                        fVar93 = auVar104._0_4_;
                        fVar97 = auVar104._4_4_;
                        local_1360._4_4_ = fVar97 * local_1260._4_4_;
                        local_1360._0_4_ = fVar93 * local_1260._0_4_;
                        fVar98 = auVar104._8_4_;
                        local_1360._8_4_ = fVar98 * local_1260._8_4_;
                        fVar99 = auVar104._12_4_;
                        local_1360._12_4_ = fVar99 * local_1260._12_4_;
                        local_1360._16_4_ = fVar125 * 0.0;
                        local_1360._20_4_ = fVar126 * 0.0;
                        local_1360._24_4_ = fVar127 * 0.0;
                        local_1360._28_4_ = 0x3f800000;
                        auVar113 = ZEXT3264(local_1360);
                        local_11a0 = local_1360;
                        local_11e0[0] = fVar63 * fVar93;
                        local_11e0[1] = fVar72 * fVar97;
                        local_11e0[2] = fVar73 * fVar98;
                        local_11e0[3] = fVar74 * fVar99;
                        fStack_11d0 = fVar75 * 0.0;
                        fStack_11cc = fVar76 * 0.0;
                        fStack_11c8 = fVar77 * 0.0;
                        local_11c0[0] = fVar78 * fVar93;
                        local_11c0[1] = fVar87 * fVar97;
                        local_11c0[2] = fVar88 * fVar98;
                        local_11c0[3] = fVar89 * fVar99;
                        fStack_11b0 = fVar90 * 0.0;
                        fStack_11ac = fVar91 * 0.0;
                        fStack_11a8 = fVar92 * 0.0;
                        fStack_11a4 = fStack_11c4;
                        auVar69._8_4_ = 0x7f800000;
                        auVar69._0_8_ = 0x7f8000007f800000;
                        auVar69._12_4_ = 0x7f800000;
                        auVar69._16_4_ = 0x7f800000;
                        auVar69._20_4_ = 0x7f800000;
                        auVar69._24_4_ = 0x7f800000;
                        auVar69._28_4_ = 0x7f800000;
                        auVar61 = vblendvps_avx(auVar69,local_1360,local_1200);
                        auVar60 = vshufps_avx(auVar61,auVar61,0xb1);
                        auVar60 = vminps_avx(auVar61,auVar60);
                        auVar65 = vshufpd_avx(auVar60,auVar60,5);
                        auVar60 = vminps_avx(auVar60,auVar65);
                        auVar65 = vpermpd_avx2(auVar60,0x4e);
                        auVar60 = vminps_avx(auVar60,auVar65);
                        auVar60 = vcmpps_avx(auVar61,auVar60,0);
                        auVar65 = local_1200 & auVar60;
                        auVar61 = local_1200;
                        if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar65 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar65 >> 0x7f,0) != '\0') ||
                              (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar65 >> 0xbf,0) != '\0') ||
                            (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar65[0x1f] < '\0') {
                          auVar61 = vandps_avx(auVar60,local_1200);
                        }
                        uVar52 = vmovmskps_avx(auVar61);
                        uVar39 = 0;
                        for (; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x80000000) {
                          uVar39 = uVar39 + 1;
                        }
                        uVar54 = (ulong)uVar39;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar77 = local_11e0[uVar54];
                          fVar93 = local_11c0[uVar54];
                          uVar40 = *(undefined4 *)(local_1180 + uVar54 * 4);
                          uVar44 = *(undefined4 *)(local_1160 + uVar54 * 4);
                          uVar2 = *(undefined4 *)(local_1140 + uVar54 * 4);
                          *(undefined4 *)(ray + k * 4 + 0x100) =
                               *(undefined4 *)(local_11a0 + uVar54 * 4);
                          *(undefined4 *)(ray + k * 4 + 0x180) = uVar40;
                          *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar44;
                          *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar2;
                          *(float *)(ray + k * 4 + 0x1e0) = fVar77;
                          *(float *)(ray + k * 4 + 0x200) = fVar93;
                          *(uint *)(ray + k * 4 + 0x220) = uStack_1338;
                          *(uint *)(ray + k * 4 + 0x240) = local_1320;
                          *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                        }
                        else {
                          local_1340 = CONCAT44(uStack_1338,uStack_1338);
                          uStack_1334 = uStack_1338;
                          uStack_1330 = uStack_1338;
                          uStack_132c = uStack_1338;
                          uStack_1328 = uStack_1338;
                          uStack_1324 = uStack_1338;
                          uStack_131c = local_1320;
                          uStack_1318 = local_1320;
                          uStack_1314 = local_1320;
                          uStack_1310 = local_1320;
                          uStack_130c = local_1320;
                          uStack_1308 = local_1320;
                          uStack_1304 = local_1320;
                          local_1300 = local_1200;
                          do {
                            uVar40 = *(undefined4 *)(ray + k * 4 + 0x100);
                            local_1060 = local_11e0[uVar54];
                            local_1040 = local_11c0[uVar54];
                            *(undefined4 *)(ray + k * 4 + 0x100) =
                                 *(undefined4 *)(local_11a0 + uVar54 * 4);
                            uVar44 = *(undefined4 *)(local_1180 + uVar54 * 4);
                            auVar86._4_4_ = uVar44;
                            auVar86._0_4_ = uVar44;
                            auVar86._8_4_ = uVar44;
                            auVar86._12_4_ = uVar44;
                            auVar86._16_4_ = uVar44;
                            auVar86._20_4_ = uVar44;
                            auVar86._24_4_ = uVar44;
                            auVar86._28_4_ = uVar44;
                            uVar2 = *(undefined4 *)(local_1160 + uVar54 * 4);
                            local_10a0._4_4_ = uVar2;
                            local_10a0._0_4_ = uVar2;
                            local_10a0._8_4_ = uVar2;
                            local_10a0._12_4_ = uVar2;
                            local_10a0._16_4_ = uVar2;
                            local_10a0._20_4_ = uVar2;
                            local_10a0._24_4_ = uVar2;
                            local_10a0._28_4_ = uVar2;
                            uVar2 = *(undefined4 *)(local_1140 + uVar54 * 4);
                            local_1080._4_4_ = uVar2;
                            local_1080._0_4_ = uVar2;
                            local_1080._8_4_ = uVar2;
                            local_1080._12_4_ = uVar2;
                            local_1080._16_4_ = uVar2;
                            local_1080._20_4_ = uVar2;
                            local_1080._24_4_ = uVar2;
                            local_1080._28_4_ = uVar2;
                            local_13f0.context = context->user;
                            local_10c0[0] = (RTCHitN)(char)uVar44;
                            local_10c0[1] = (RTCHitN)(char)((uint)uVar44 >> 8);
                            local_10c0[2] = (RTCHitN)(char)((uint)uVar44 >> 0x10);
                            local_10c0[3] = (RTCHitN)(char)((uint)uVar44 >> 0x18);
                            local_10c0[4] = (RTCHitN)(char)uVar44;
                            local_10c0[5] = (RTCHitN)(char)((uint)uVar44 >> 8);
                            local_10c0[6] = (RTCHitN)(char)((uint)uVar44 >> 0x10);
                            local_10c0[7] = (RTCHitN)(char)((uint)uVar44 >> 0x18);
                            local_10c0[8] = (RTCHitN)(char)uVar44;
                            local_10c0[9] = (RTCHitN)(char)((uint)uVar44 >> 8);
                            local_10c0[10] = (RTCHitN)(char)((uint)uVar44 >> 0x10);
                            local_10c0[0xb] = (RTCHitN)(char)((uint)uVar44 >> 0x18);
                            local_10c0[0xc] = (RTCHitN)(char)uVar44;
                            local_10c0[0xd] = (RTCHitN)(char)((uint)uVar44 >> 8);
                            local_10c0[0xe] = (RTCHitN)(char)((uint)uVar44 >> 0x10);
                            local_10c0[0xf] = (RTCHitN)(char)((uint)uVar44 >> 0x18);
                            local_10c0[0x10] = (RTCHitN)(char)uVar44;
                            local_10c0[0x11] = (RTCHitN)(char)((uint)uVar44 >> 8);
                            local_10c0[0x12] = (RTCHitN)(char)((uint)uVar44 >> 0x10);
                            local_10c0[0x13] = (RTCHitN)(char)((uint)uVar44 >> 0x18);
                            local_10c0[0x14] = (RTCHitN)(char)uVar44;
                            local_10c0[0x15] = (RTCHitN)(char)((uint)uVar44 >> 8);
                            local_10c0[0x16] = (RTCHitN)(char)((uint)uVar44 >> 0x10);
                            local_10c0[0x17] = (RTCHitN)(char)((uint)uVar44 >> 0x18);
                            local_10c0[0x18] = (RTCHitN)(char)uVar44;
                            local_10c0[0x19] = (RTCHitN)(char)((uint)uVar44 >> 8);
                            local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar44 >> 0x10);
                            local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar44 >> 0x18);
                            local_10c0[0x1c] = (RTCHitN)(char)uVar44;
                            local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar44 >> 8);
                            local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar44 >> 0x10);
                            local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar44 >> 0x18);
                            fStack_105c = local_1060;
                            fStack_1058 = local_1060;
                            fStack_1054 = local_1060;
                            fStack_1050 = local_1060;
                            fStack_104c = local_1060;
                            fStack_1048 = local_1060;
                            fStack_1044 = local_1060;
                            fStack_103c = local_1040;
                            fStack_1038 = local_1040;
                            fStack_1034 = local_1040;
                            fStack_1030 = local_1040;
                            fStack_102c = local_1040;
                            fStack_1028 = local_1040;
                            fStack_1024 = local_1040;
                            local_1020 = local_1340;
                            uStack_1018 = CONCAT44(uStack_1334,uStack_1338);
                            uStack_1010 = CONCAT44(uStack_132c,uStack_1330);
                            uStack_1008 = CONCAT44(uStack_1324,uStack_1328);
                            local_1000 = CONCAT44(uStack_131c,local_1320);
                            uStack_ff8 = CONCAT44(uStack_1314,uStack_1318);
                            uStack_ff0 = CONCAT44(uStack_130c,uStack_1310);
                            uStack_fe8 = CONCAT44(uStack_1304,uStack_1308);
                            auVar61 = vpcmpeqd_avx2(auVar86,auVar86);
                            uStack_fdc = (local_13f0.context)->instID[0];
                            local_fe0 = uStack_fdc;
                            uStack_fd8 = uStack_fdc;
                            uStack_fd4 = uStack_fdc;
                            uStack_fd0 = uStack_fdc;
                            uStack_fcc = uStack_fdc;
                            uStack_fc8 = uStack_fdc;
                            uStack_fc4 = uStack_fdc;
                            uStack_fbc = (local_13f0.context)->instPrimID[0];
                            local_fc0 = uStack_fbc;
                            uStack_fb8 = uStack_fbc;
                            uStack_fb4 = uStack_fbc;
                            uStack_fb0 = uStack_fbc;
                            uStack_fac = uStack_fbc;
                            uStack_fa8 = uStack_fbc;
                            uStack_fa4 = uStack_fbc;
                            local_12e0 = local_1120._0_8_;
                            uStack_12d8 = local_1120._8_8_;
                            uStack_12d0 = local_1120._16_8_;
                            uStack_12c8 = local_1120._24_8_;
                            local_13f0.valid = (int *)&local_12e0;
                            local_13f0.geometryUserPtr = pGVar5->userPtr;
                            local_13f0.hit = local_10c0;
                            local_13f0.N = 8;
                            local_13f0.ray = (RTCRayN *)ray;
                            if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar61 = ZEXT1632(auVar61._0_16_);
                              (*pGVar5->intersectionFilterN)(&local_13f0);
                              auVar113 = ZEXT3264(local_1360);
                              auVar61 = vpcmpeqd_avx2(auVar61,auVar61);
                            }
                            auVar35._8_8_ = uStack_12d8;
                            auVar35._0_8_ = local_12e0;
                            auVar35._16_8_ = uStack_12d0;
                            auVar35._24_8_ = uStack_12c8;
                            auVar65 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                    auVar35);
                            auVar60 = auVar61 & ~auVar65;
                            if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar60 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar60 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar60 >> 0x7f,0) == '\0') &&
                                  (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar60 >> 0xbf,0) == '\0') &&
                                (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar60[0x1f]) {
                              auVar65 = auVar65 ^ auVar61;
                            }
                            else {
                              p_Var6 = context->args->filter;
                              if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar61 = ZEXT1632(auVar61._0_16_);
                                (*p_Var6)(&local_13f0);
                                auVar113 = ZEXT3264(local_1360);
                                auVar61 = vpcmpeqd_avx2(auVar61,auVar61);
                              }
                              auVar36._8_8_ = uStack_12d8;
                              auVar36._0_8_ = local_12e0;
                              auVar36._16_8_ = uStack_12d0;
                              auVar36._24_8_ = uStack_12c8;
                              auVar66 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                      auVar36);
                              auVar65 = auVar66 ^ auVar61;
                              auVar60 = auVar61 & ~auVar66;
                              if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar60 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar60 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar60 >> 0x7f,0) != '\0')
                                    || (auVar60 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar60 >> 0xbf,0) != '\0')
                                  || (auVar60 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar60[0x1f] < '\0') {
                                auVar70._0_4_ = auVar66._0_4_ ^ auVar61._0_4_;
                                auVar70._4_4_ = auVar66._4_4_ ^ auVar61._4_4_;
                                auVar70._8_4_ = auVar66._8_4_ ^ auVar61._8_4_;
                                auVar70._12_4_ = auVar66._12_4_ ^ auVar61._12_4_;
                                auVar70._16_4_ = auVar66._16_4_ ^ auVar61._16_4_;
                                auVar70._20_4_ = auVar66._20_4_ ^ auVar61._20_4_;
                                auVar70._24_4_ = auVar66._24_4_ ^ auVar61._24_4_;
                                auVar70._28_4_ = auVar66._28_4_ ^ auVar61._28_4_;
                                auVar61 = vmaskmovps_avx(auVar70,*(undefined1 (*) [32])
                                                                  local_13f0.hit);
                                *(undefined1 (*) [32])(local_13f0.ray + 0x180) = auVar61;
                                auVar61 = vmaskmovps_avx(auVar70,*(undefined1 (*) [32])
                                                                  (local_13f0.hit + 0x20));
                                *(undefined1 (*) [32])(local_13f0.ray + 0x1a0) = auVar61;
                                auVar61 = vmaskmovps_avx(auVar70,*(undefined1 (*) [32])
                                                                  (local_13f0.hit + 0x40));
                                *(undefined1 (*) [32])(local_13f0.ray + 0x1c0) = auVar61;
                                auVar61 = vmaskmovps_avx(auVar70,*(undefined1 (*) [32])
                                                                  (local_13f0.hit + 0x60));
                                *(undefined1 (*) [32])(local_13f0.ray + 0x1e0) = auVar61;
                                auVar61 = vmaskmovps_avx(auVar70,*(undefined1 (*) [32])
                                                                  (local_13f0.hit + 0x80));
                                *(undefined1 (*) [32])(local_13f0.ray + 0x200) = auVar61;
                                auVar61 = vpmaskmovd_avx2(auVar70,*(undefined1 (*) [32])
                                                                   (local_13f0.hit + 0xa0));
                                *(undefined1 (*) [32])(local_13f0.ray + 0x220) = auVar61;
                                auVar61 = vpmaskmovd_avx2(auVar70,*(undefined1 (*) [32])
                                                                   (local_13f0.hit + 0xc0));
                                *(undefined1 (*) [32])(local_13f0.ray + 0x240) = auVar61;
                                auVar61 = vpmaskmovd_avx2(auVar70,*(undefined1 (*) [32])
                                                                   (local_13f0.hit + 0xe0));
                                *(undefined1 (*) [32])(local_13f0.ray + 0x260) = auVar61;
                                auVar61 = vpmaskmovd_avx2(auVar70,*(undefined1 (*) [32])
                                                                   (local_13f0.hit + 0x100));
                                *(undefined1 (*) [32])(local_13f0.ray + 0x280) = auVar61;
                              }
                            }
                            if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar65 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar65 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar65 >> 0x7f,0) == '\0') &&
                                  (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar65 >> 0xbf,0) == '\0') &&
                                (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar65[0x1f]) {
                              *(undefined4 *)(ray + k * 4 + 0x100) = uVar40;
                            }
                            *(undefined4 *)(local_1300 + uVar54 * 4) = 0;
                            uVar40 = *(undefined4 *)(ray + k * 4 + 0x100);
                            auVar62._4_4_ = uVar40;
                            auVar62._0_4_ = uVar40;
                            auVar62._8_4_ = uVar40;
                            auVar62._12_4_ = uVar40;
                            auVar62._16_4_ = uVar40;
                            auVar62._20_4_ = uVar40;
                            auVar62._24_4_ = uVar40;
                            auVar62._28_4_ = uVar40;
                            auVar60 = vcmpps_avx(auVar113._0_32_,auVar62,2);
                            auVar61 = vandps_avx(auVar60,local_1300);
                            local_1300 = local_1300 & auVar60;
                            bVar33 = (local_1300 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar34 = (local_1300 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar32 = (local_1300 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar31 = SUB321(local_1300 >> 0x7f,0) != '\0';
                            bVar30 = (local_1300 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar29 = SUB321(local_1300 >> 0xbf,0) != '\0';
                            bVar28 = (local_1300 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar27 = local_1300[0x1f] < '\0';
                            if (((((((bVar33 || bVar34) || bVar32) || bVar31) || bVar30) || bVar29)
                                || bVar28) || bVar27) {
                              auVar71._8_4_ = 0x7f800000;
                              auVar71._0_8_ = 0x7f8000007f800000;
                              auVar71._12_4_ = 0x7f800000;
                              auVar71._16_4_ = 0x7f800000;
                              auVar71._20_4_ = 0x7f800000;
                              auVar71._24_4_ = 0x7f800000;
                              auVar71._28_4_ = 0x7f800000;
                              auVar60 = vblendvps_avx(auVar71,auVar113._0_32_,auVar61);
                              auVar65 = vshufps_avx(auVar60,auVar60,0xb1);
                              auVar65 = vminps_avx(auVar60,auVar65);
                              auVar66 = vshufpd_avx(auVar65,auVar65,5);
                              auVar65 = vminps_avx(auVar65,auVar66);
                              auVar66 = vpermpd_avx2(auVar65,0x4e);
                              auVar65 = vminps_avx(auVar65,auVar66);
                              auVar65 = vcmpps_avx(auVar60,auVar65,0);
                              auVar66 = auVar61 & auVar65;
                              auVar60 = auVar61;
                              if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar66 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar66 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar66 >> 0x7f,0) != '\0')
                                    || (auVar66 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar66 >> 0xbf,0) != '\0')
                                  || (auVar66 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar66[0x1f] < '\0') {
                                auVar60 = vandps_avx(auVar65,auVar61);
                              }
                              uVar52 = vmovmskps_avx(auVar60);
                              uVar39 = 0;
                              for (; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x80000000) {
                                uVar39 = uVar39 + 1;
                              }
                              uVar54 = (ulong)uVar39;
                            }
                            local_1300 = auVar61;
                          } while (((((((bVar33 || bVar34) || bVar32) || bVar31) || bVar30) ||
                                    bVar29) || bVar28) || bVar27);
                        }
                      }
                    }
                  }
                }
                uVar55 = uVar55 - 1 & uVar55;
              } while (uVar55 != 0);
            }
            lVar42 = lVar42 + 1;
          } while (lVar42 != uVar51 - 8);
        }
        local_1490._4_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
        local_1490._0_4_ = local_1490._4_4_;
        local_1490._8_4_ = local_1490._4_4_;
        local_1490._12_4_ = local_1490._4_4_;
        auVar113 = ZEXT1664(local_13b0);
        auVar116 = ZEXT1664(local_13c0);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }